

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.cc
# Opt level: O0

void __thiscall re2c::DFA::split(DFA *this,State *s)

{
  State *this_00;
  Span *pSVar1;
  State *move;
  State *s_local;
  DFA *this_local;
  
  this_00 = (State *)operator_new(0x58);
  State::State(this_00);
  addState(this,this_00,s);
  Action::set_move(&this_00->action);
  this_00->rule = s->rule;
  this_00->fill = s->fill;
  Go::operator=(&this_00->go,&s->go);
  s->rule = (RuleOp *)0x0;
  (s->go).nSpans = 1;
  pSVar1 = allocate<re2c::Span>(1);
  (s->go).span = pSVar1;
  ((s->go).span)->ub = this->ubChar;
  ((s->go).span)->to = this_00;
  return;
}

Assistant:

void DFA::split(State *s)
{
	State *move = new State;
	addState(move, s);
	move->action.set_move ();
	move->rule = s->rule;
	move->fill = s->fill;
	move->go = s->go;
	s->rule = NULL;
	s->go.nSpans = 1;
	s->go.span = allocate<Span> (1);
	s->go.span[0].ub = ubChar;
	s->go.span[0].to = move;
}